

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPerm.c
# Opt level: O1

int Abc_ZddUniqueCreate(Abc_ZddMan *p,int Var,int True,int False)

{
  int iVar1;
  Abc_ZddObj *pAVar2;
  int iVar3;
  uint uVar4;
  int *piVar5;
  
  if ((Var < 0) || (p->nVars <= Var)) {
    __assert_fail("Var >= 0 && Var < p->nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilPerm.c"
                  ,0x8f,"int Abc_ZddUniqueCreate(Abc_ZddMan *, int, int, int)");
  }
  pAVar2 = p->pObjs;
  if ((int)(*(uint *)(pAVar2 + True) & 0x7fffffff) <= Var) {
    __assert_fail("Var < Abc_ZddObjVar(p, True)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilPerm.c"
                  ,0x90,"int Abc_ZddUniqueCreate(Abc_ZddMan *, int, int, int)");
  }
  if ((int)(*(uint *)(pAVar2 + False) & 0x7fffffff) <= Var) {
    __assert_fail("Var < Abc_ZddObjVar(p, False)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilPerm.c"
                  ,0x91,"int Abc_ZddUniqueCreate(Abc_ZddMan *, int, int, int)");
  }
  if (True != 0) {
    uVar4 = False * 0xb5051 + True * 0x40f1f9 + Var * 0xc00005 & p->nUniqueMask;
    iVar1 = p->pUnique[uVar4];
    if (iVar1 == 0) {
      piVar5 = p->pUnique + uVar4;
    }
    else {
      do {
        iVar3 = iVar1;
        if ((((*(uint *)(pAVar2 + iVar3) & 0x7fffffff) == Var) && (pAVar2[iVar3].True == True)) &&
           (pAVar2[iVar3].False == False)) {
          return iVar3;
        }
        iVar1 = p->pNexts[iVar3];
      } while (iVar1 != 0);
      piVar5 = p->pNexts + iVar3;
    }
    if (p->nObjs == p->nObjsAlloc) {
      printf("Aborting because the number of nodes exceeded %d.\n");
      fflush(_stdout);
    }
    iVar1 = p->nObjs;
    if (p->nObjsAlloc <= iVar1) {
      __assert_fail("p->nObjs < p->nObjsAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilPerm.c"
                    ,0x9b,"int Abc_ZddUniqueCreate(Abc_ZddMan *, int, int, int)");
    }
    p->nObjs = iVar1 + 1;
    *piVar5 = iVar1;
    *(uint *)(p->pObjs + iVar1) = *(uint *)(p->pObjs + iVar1) & 0x80000000 | Var;
    pAVar2 = p->pObjs;
    pAVar2[*piVar5].True = True;
    pAVar2[*piVar5].False = False;
    False = *piVar5;
  }
  return False;
}

Assistant:

static inline int Abc_ZddUniqueCreate( Abc_ZddMan * p, int Var, int True, int False )
{
    assert( Var >= 0 && Var < p->nVars );
    assert( Var < Abc_ZddObjVar(p, True) );
    assert( Var < Abc_ZddObjVar(p, False) );
    if ( True == 0 )
        return False;
    {
        int *q = p->pUnique + (Abc_ZddHash(Var, True, False) & p->nUniqueMask);
        for ( ; *q; q = p->pNexts + *q )
            if ( p->pObjs[*q].Var == (unsigned)Var && p->pObjs[*q].True == (unsigned)True && p->pObjs[*q].False == (unsigned)False )
                return *q;
        if ( p->nObjs == p->nObjsAlloc )
            printf( "Aborting because the number of nodes exceeded %d.\n", p->nObjsAlloc ), fflush(stdout);
        assert( p->nObjs < p->nObjsAlloc );     
        *q = p->nObjs++;
        p->pObjs[*q].Var = Var;
        p->pObjs[*q].True = True;
        p->pObjs[*q].False = False;
//        printf( "Added node %3d: Var = %3d.  True = %3d.  False = %3d\n", *q, Var, True, False );
        return *q;
    }
}